

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,char *fromFile,char *toFile,MatchProperties match_properties)

{
  cmCommand *pcVar1;
  char *pcVar2;
  bool bVar3;
  ostream *poVar4;
  mode_t local_474;
  byte local_3e1;
  mode_t local_3d4;
  undefined1 local_3d0 [4];
  mode_t permissions;
  ostringstream local_3b0 [8];
  ostringstream e_1;
  mode_t local_234;
  undefined1 local_230 [4];
  mode_t perm;
  ostringstream local_210 [8];
  ostringstream e;
  allocator local_91;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator local_59;
  string local_58;
  byte local_31;
  char *pcStack_30;
  bool copy;
  char *toFile_local;
  char *fromFile_local;
  cmFileCopier *this_local;
  mode_t mStack_10;
  MatchProperties match_properties_local;
  
  local_31 = 1;
  pcStack_30 = toFile;
  toFile_local = fromFile;
  fromFile_local = (char *)this;
  unique0x10000407 = match_properties;
  if (((this->Always & 1U) == 0) &&
     (bVar3 = cmFileTimeComparison::FileTimesDiffer(&this->FileTimes,fromFile,toFile), !bVar3)) {
    local_31 = 0;
  }
  (*this->_vptr_cmFileCopier[4])(this,pcStack_30,0,(ulong)(local_31 & 1));
  pcVar2 = toFile_local;
  local_5a = 0;
  local_6d = 0;
  local_3e1 = 0;
  if ((local_31 & 1) != 0) {
    std::allocator<char>::allocator();
    local_5a = 1;
    std::__cxx11::string::string((string *)&local_58,pcVar2,&local_59);
    pcVar2 = pcStack_30;
    local_6d = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_90,pcVar2,&local_91);
    bVar3 = cmsys::SystemTools::CopyAFile(&local_58,&local_90,true);
    local_3e1 = bVar3 ^ 0xff;
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
  }
  if ((local_6d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  if ((local_3e1 & 1) == 0) {
    if (((local_31 & 1) != 0) && ((this->Always & 1U) == 0)) {
      local_234 = 0;
      bVar3 = cmsys::SystemTools::GetPermissions(pcStack_30,&local_234);
      if (bVar3) {
        cmsys::SystemTools::SetPermissions(pcStack_30,local_234 | mode_owner_write,false);
      }
      bVar3 = cmSystemTools::CopyFileTime(toFile_local,pcStack_30);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_3b0);
        poVar4 = std::operator<<((ostream *)local_3b0,this->Name);
        poVar4 = std::operator<<(poVar4," cannot set modification time on \"");
        poVar4 = std::operator<<(poVar4,pcStack_30);
        std::operator<<(poVar4,"\"");
        pcVar1 = &this->FileCommand->super_cmCommand;
        std::__cxx11::ostringstream::str();
        cmCommand::SetError(pcVar1,(string *)local_3d0);
        std::__cxx11::string::~string((string *)local_3d0);
        match_properties_local._3_1_ = 0;
        std::__cxx11::ostringstream::~ostringstream(local_3b0);
        goto LAB_00664881;
      }
    }
    if (mStack_10 == 0) {
      local_474 = this->FilePermissions;
    }
    else {
      local_474 = mStack_10;
    }
    local_3d4 = local_474;
    if (local_474 == 0) {
      cmsys::SystemTools::GetPermissions(toFile_local,&local_3d4);
    }
    match_properties_local._3_1_ = SetPermissions(this,pcStack_30,local_3d4);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_210);
    poVar4 = std::operator<<((ostream *)local_210,this->Name);
    poVar4 = std::operator<<(poVar4," cannot copy file \"");
    poVar4 = std::operator<<(poVar4,toFile_local);
    poVar4 = std::operator<<(poVar4,"\" to \"");
    poVar4 = std::operator<<(poVar4,pcStack_30);
    std::operator<<(poVar4,"\".");
    pcVar1 = &this->FileCommand->super_cmCommand;
    std::__cxx11::ostringstream::str();
    cmCommand::SetError(pcVar1,(string *)local_230);
    std::__cxx11::string::~string((string *)local_230);
    match_properties_local._3_1_ = 0;
    std::__cxx11::ostringstream::~ostringstream(local_210);
  }
LAB_00664881:
  return (bool)(match_properties_local._3_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallFile(const char* fromFile, const char* toFile,
                               MatchProperties match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if (!this->Always) {
    // If both files exist with the same time do not copy.
    if (!this->FileTimes.FileTimesDiffer(fromFile, toFile)) {
      copy = false;
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if (copy && !cmSystemTools::CopyAFile(fromFile, toFile, true)) {
    std::ostringstream e;
    e << this->Name << " cannot copy file \"" << fromFile << "\" to \""
      << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Set the file modification time of the destination file.
  if (copy && !this->Always) {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if (cmSystemTools::GetPermissions(toFile, perm)) {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
    }
    if (!cmSystemTools::CopyFileTime(fromFile, toFile)) {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \"" << toFile
        << "\"";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }

  // Set permissions of the destination file.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->FilePermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
  }
  return this->SetPermissions(toFile, permissions);
}